

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

_Bool parse_number(element_t *element,int id,float *number,_Bool percent,_Bool inherit)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  _Bool _Var4;
  int iVar5;
  attribute *paVar6;
  string_t *unaff_RBX;
  string_t *psVar7;
  char *end;
  float fVar8;
  char *it;
  char *local_40;
  float *local_38;
  
  local_38 = number;
  do {
    for (paVar6 = element->attributes; paVar6 != (attribute *)0x0; paVar6 = paVar6->next) {
      if (paVar6->id == id) {
        if (((inherit) && ((paVar6->value).length == 7)) &&
           (iVar5 = strncmp((paVar6->value).data,"inherit",7), iVar5 == 0)) {
          bVar2 = true;
        }
        else {
          bVar2 = false;
          unaff_RBX = &paVar6->value;
        }
        if (!bVar2) {
          bVar2 = false;
          goto LAB_001073a4;
        }
        break;
      }
    }
    element = element->parent;
    bVar2 = true;
LAB_001073a4:
    pfVar3 = local_38;
    psVar7 = unaff_RBX;
    if (((!bVar2) || (psVar7 = (string_t *)0x0, !inherit)) || (element == (element_t *)0x0)) {
      if (psVar7 == (string_t *)0x0) {
        _Var4 = false;
      }
      else {
        local_40 = psVar7->data;
        end = local_40 + psVar7->length;
        _Var4 = parse_float(&local_40,end,local_38);
        if (percent && _Var4) {
          if ((local_40 < end) && (*local_40 == '%')) {
            *pfVar3 = *pfVar3 / 100.0;
          }
          fVar1 = *pfVar3;
          fVar8 = 0.0;
          if ((0.0 <= fVar1) && (fVar8 = 1.0, fVar1 <= 1.0)) {
            fVar8 = fVar1;
          }
          *pfVar3 = fVar8;
        }
      }
      return _Var4;
    }
  } while( true );
}

Assistant:

static bool parse_number(const element_t* element, int id, float* number, bool percent, bool inherit)
{
    const string_t* value = find_attribute(element, id, inherit);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(!parse_float(&it, end, number))
        return false;
    if(percent) {
        if(skip_delim(&it, end, '%'))
            *number /= 100.f;
        *number = CLAMP(*number, 0.f, 1.f);
    }

    return true;
}